

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

Error asmjit::v1_14::Formatter::formatOperand
                (String *sb,FormatFlags formatFlags,BaseEmitter *emitter,Arch arch,Operand_ *op)

{
  char in_CL;
  Operand_ *in_stack_00000058;
  Arch in_stack_00000067;
  BaseEmitter *in_stack_00000068;
  FormatFlags in_stack_00000074;
  BaseEmitter *in_stack_00000078;
  FormatFlags in_stack_00000084;
  String *in_stack_00000088;
  bool local_3e;
  bool local_3c;
  bool local_39;
  Error local_c;
  
  local_39 = in_CL == '\x01' || in_CL == '\x02';
  if (local_39) {
    local_c = x86::FormatterInternal::formatOperand
                        ((String *)in_stack_00000078,in_stack_00000074,in_stack_00000068,
                         in_stack_00000067,in_stack_00000058);
  }
  else {
    local_3c = true;
    if (in_CL != '\x05' && in_CL != '\v') {
      local_3c = in_CL == '\a' || in_CL == '\r';
    }
    local_3e = true;
    if (!local_3c) {
      local_3e = in_CL == '\x06' || in_CL == '\f';
    }
    if (local_3e) {
      local_c = arm::FormatterInternal::formatOperand
                          (in_stack_00000088,in_stack_00000084,in_stack_00000078,
                           in_stack_00000074._3_1_,(Operand_ *)in_stack_00000068);
    }
    else {
      local_c = 4;
    }
  }
  return local_c;
}

Assistant:

Error formatOperand(
  String& sb,
  FormatFlags formatFlags,
  const BaseEmitter* emitter,
  Arch arch,
  const Operand_& op) noexcept {

#if !defined(ASMJIT_NO_X86)
  if (Environment::isFamilyX86(arch))
    return x86::FormatterInternal::formatOperand(sb, formatFlags, emitter, arch, op);
#endif

#if !defined(ASMJIT_NO_AARCH64)
  if (Environment::isFamilyARM(arch))
    return arm::FormatterInternal::formatOperand(sb, formatFlags, emitter, arch, op);
#endif

  return kErrorInvalidArch;
}